

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void duckdb::TemplatedGetSortKeyLength<duckdb::SortKeyConstantOperator<bool>>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyLengthInfo *result)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  pointer puVar3;
  unsigned_long uVar4;
  ulong uVar5;
  idx_t iVar6;
  
  if (chunk.start < chunk.end) {
    puVar1 = (vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    psVar2 = ((vector_data->format).sel)->sel_vector;
    puVar3 = (result->variable_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar5 = chunk.start;
      if (psVar2 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar2[chunk.start];
      }
      iVar6 = chunk.start;
      if (chunk.has_result_index != false) {
        iVar6 = chunk.result_index;
      }
      uVar4 = puVar3[iVar6];
      puVar3[iVar6] = uVar4 + 1;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
        puVar3[iVar6] = uVar4 + 2;
      }
      chunk.start = chunk.start + 1;
    } while (chunk.end != chunk.start);
  }
  return;
}

Assistant:

void TemplatedGetSortKeyLength(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyLengthInfo &result) {
	auto &format = vector_data.format;
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto idx = format.sel->get_index(r);
		auto result_index = chunk.GetResultIndex(r);
		result.variable_lengths[result_index]++; // every value is prefixed by a validity byte

		if (!format.validity.RowIsValid(idx)) {
			continue;
		}
		result.variable_lengths[result_index] += OP::GetEncodeLength(data[idx]);
	}
}